

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O3

DFsVariable * __thiscall DFsScript::FindVariable(DFsScript *this,char *name)

{
  DFsVariable *pDVar1;
  DFsScript *this_00;
  
  while( true ) {
    this_00 = this;
    pDVar1 = VariableForName(this_00,name);
    if (pDVar1 != (DFsVariable *)0x0) {
      return pDVar1;
    }
    this = (this_00->parent).field_0.p;
    if (this == (DFsScript *)0x0) break;
    if (((this->super_DObject).ObjectFlags & 0x20) != 0) {
      (this_00->parent).field_0.p = (DFsScript *)0x0;
      return (DFsVariable *)0x0;
    }
  }
  return (DFsVariable *)0x0;
}

Assistant:

DFsVariable *DFsScript::FindVariable(const char *name)
{
	DFsVariable *var;
	DFsScript *current = this;
	
	while(current)
    {
		// check this script
		if ((var = current->VariableForName(name)))
			return var;
		current = current->parent;    // try the parent of this one
    }
	
	return NULL;    // no variable
}